

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptArray.cpp
# Opt level: O2

JavascriptArray *
Js::JavascriptArray::BoxStackInstance<Js::JavascriptArray>(JavascriptArray *instance,bool deepCopy)

{
  code *pcVar1;
  bool bVar2;
  undefined4 *puVar3;
  DynamicTypeHandler *this;
  type_info *ptVar4;
  Type this_00;
  Recycler *pRVar5;
  Type *pTVar6;
  undefined1 local_50 [8];
  TrackAllocData data;
  
  bVar2 = ThreadContext::IsOnStack(instance);
  if (!bVar2) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar3 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/JavascriptArray.cpp"
                                ,0x2f6d,"(ThreadContext::IsOnStack(instance))",
                                "ThreadContext::IsOnStack(instance)");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    *puVar3 = 0;
  }
  if (deepCopy) {
    pTVar6 = (Type *)0x0;
  }
  else {
    if (instance[-1].segmentUnion != (Type)0x0) {
      return (JavascriptArray *)instance[-1].segmentUnion;
    }
    pTVar6 = &instance[-1].segmentUnion;
  }
  this = DynamicObject::GetTypeHandler((DynamicObject *)instance);
  ptVar4 = (type_info *)DynamicTypeHandler::GetInlineSlotsSize(this);
  bVar2 = ThreadContext::IsOnStack((instance->head).ptr);
  if (bVar2 || deepCopy) {
    if (deepCopy) {
      this_00 = (Type)DeepCopyInstance<Js::JavascriptArray>(instance);
      goto LAB_00a68017;
    }
    pRVar5 = RecyclableObject::GetRecycler((RecyclableObject *)instance);
    data.typeinfo = ptVar4 + (ulong)((instance->head).ptr)->size * 8 + 0x18;
    local_50 = (undefined1  [8])&typeinfo;
    data.plusSize = 0xffffffffffffffff;
    data.count = (size_t)anon_var_dwarf_693dcf2;
    data.filename._0_4_ = 0x2f90;
    pRVar5 = Memory::Recycler::TrackAllocInfo(pRVar5,(TrackAllocData *)local_50);
    this_00 = (Type)new<Memory::Recycler>(0x38,pRVar5,0x398e98,0);
    bVar2 = true;
  }
  else {
    pRVar5 = RecyclableObject::GetRecycler((RecyclableObject *)instance);
    if (ptVar4 == (type_info *)0x0) {
      local_50 = (undefined1  [8])&typeinfo;
      data.typeinfo = (type_info *)0x0;
      data.plusSize = 0xffffffffffffffff;
      data.count = (size_t)anon_var_dwarf_693dcf2;
      data.filename._0_4_ = 0x2f99;
      pRVar5 = Memory::Recycler::TrackAllocInfo(pRVar5,(TrackAllocData *)local_50);
      this_00 = (Type)new<Memory::Recycler>(0x38,pRVar5,0x37a1d4);
    }
    else {
      local_50 = (undefined1  [8])&typeinfo;
      data.plusSize = 0xffffffffffffffff;
      data.count = (size_t)anon_var_dwarf_693dcf2;
      data.filename._0_4_ = 0x2f95;
      data.typeinfo = ptVar4;
      pRVar5 = Memory::Recycler::TrackAllocInfo(pRVar5,(TrackAllocData *)local_50);
      this_00 = (Type)new<Memory::Recycler>(0x38,pRVar5,0x398e98,0);
    }
    bVar2 = false;
  }
  JavascriptArray((JavascriptArray *)this_00,instance,bVar2,false);
LAB_00a68017:
  if (pTVar6 != (Type *)0x0) {
    *pTVar6 = this_00;
  }
  return (JavascriptArray *)this_00;
}

Assistant:

T * JavascriptArray::BoxStackInstance(T * instance, bool deepCopy)
    {
        Assert(ThreadContext::IsOnStack(instance));
        T * boxedInstance;
        T ** boxedInstanceRef;
        if (!deepCopy)
        {
            // On the stack, the we reserved a pointer before the object as to store the boxed value
            boxedInstanceRef = ((T **)instance) - 1;
            boxedInstance = *boxedInstanceRef;
            if (boxedInstance)
            {
                return boxedInstance;
            }
        }
        else
        {
            // When doing a deep copy, do not cache the boxed value to ensure that only shallow copies
            // are reused
            boxedInstance = nullptr;
            boxedInstanceRef = nullptr;
        }

        const size_t inlineSlotsSize = instance->GetTypeHandler()->GetInlineSlotsSize();
        if (ThreadContext::IsOnStack(instance->head) || deepCopy)
        {
            // Reallocate both the object as well as the head segment when the head is on the stack or
            // when a deep copy is needed. This is to prevent a scenario where box may leave either one
            // on the stack when both must be on the heap.
            if (deepCopy)
            {
                boxedInstance = DeepCopyInstance(instance);
            }
            else
            {
                boxedInstance = RecyclerNewPlusZ(instance->GetRecycler(),
                    inlineSlotsSize + sizeof(Js::SparseArraySegmentBase) + instance->head->size * sizeof(typename T::TElement),
                    T, instance, true /*boxHead*/, false /*deepCopy*/);
            }
        }
        else if(inlineSlotsSize)
        {
            boxedInstance = RecyclerNewPlusZ(instance->GetRecycler(), inlineSlotsSize, T, instance, false, false);
        }
        else
        {
            boxedInstance = RecyclerNew(instance->GetRecycler(), T, instance, false, false);
        }

        if (boxedInstanceRef != nullptr)
        {
            *boxedInstanceRef = boxedInstance;
        }
        return boxedInstance;
    }